

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall Compiler::visit(Compiler *this,FloatLit *node)

{
  long lVar1;
  value_type_conflict1 val;
  value_type_conflict1 local_22;
  uchar local_21;
  double local_20;
  
  local_20 = node->m_value;
  local_21 = '\n';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_buffer,&local_21);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_22 = *(value_type_conflict1 *)((long)&local_20 + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_buffer,&local_22)
    ;
  }
  return;
}

Assistant:

void Compiler::visit(AST::FloatLit *node) {
    std::array<Bytecode, sizeof(double)> tmp = {};
    memcpy(tmp.data(), &node->m_value, sizeof(double));
    m_buffer.push_back(Opcode::DCONST);
    for (auto val : tmp) {
        m_buffer.push_back(val);
    }
}